

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>::CommsBroker
          (CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker> *this,bool arg)

{
  undefined1 in_SIL;
  undefined8 *in_RDI;
  CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker> *in_stack_00000070;
  __integral_type_conflict in_stack_ffffffffffffffdc;
  undefined1 __i;
  uint in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  undefined7 in_stack_fffffffffffffff0;
  
  CoreBroker::CoreBroker
            ((CoreBroker *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),
             SUB81((ulong)in_RDI >> 0x38,0));
  *in_RDI = &PTR__CommsBroker_0092a168;
  in_RDI[1] = &PTR__CommsBroker_0092a2c0;
  uVar1 = 0;
  std::atomic<int>::atomic
            ((atomic<int> *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  __i = (undefined1)((uint)in_stack_ffffffffffffffdc >> 0x18);
  std::unique_ptr<helics::ipc::IpcComms,std::default_delete<helics::ipc::IpcComms>>::
  unique_ptr<std::default_delete<helics::ipc::IpcComms>,void>
            ((unique_ptr<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffffe0));
  std::atomic<bool>::atomic((atomic<bool> *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),(bool)__i);
  loadComms(in_stack_00000070);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::CommsBroker(bool arg) noexcept: BrokerT(arg)
{
    static_assert(std::is_base_of<CommsInterface, COMMS>::value,
                  "COMMS object must be a CommsInterface Object");
    static_assert(std::is_base_of<BrokerBase, BrokerT>::value,
                  "Broker must be an object  with a base of BrokerBase");
    loadComms();
}